

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

Gia_Man_t * Sbd_ManDerive(Sbd_Man_t *pMan,Gia_Man_t *p,Vec_Int_t *vMirrors)

{
  ulong uVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *p_00;
  char *pcVar6;
  uint *puVar7;
  Gia_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  Gia_Man_t *p_01;
  int iVar10;
  
  Gia_ManFillValue(p);
  p_00 = Gia_ManStart(p->nObjs);
  pcVar6 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar6;
  pcVar6 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar6;
  if (p->pMuxes != (uint *)0x0) {
    puVar7 = (uint *)calloc((long)p->nObjs,4);
    p_00->pMuxes = puVar7;
  }
  p->pObjs->Value = 0;
  Gia_ManHashAlloc(p_00);
  for (iVar10 = 0; iVar10 < p->vCis->nSize; iVar10 = iVar10 + 1) {
    pGVar8 = Gia_ManCi(p,iVar10);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    pGVar9 = Gia_ManAppendObj(p_00);
    uVar1 = *(ulong *)pGVar9;
    *(ulong *)pGVar9 = uVar1 | 0x9fffffff;
    *(ulong *)pGVar9 =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar2 = p_00->vCis;
    iVar3 = Gia_ObjId(p_00,pGVar9);
    Vec_IntPush(pVVar2,iVar3);
    iVar3 = Gia_ObjId(p_00,pGVar9);
    pGVar8->Value = iVar3 * 2;
  }
  for (iVar10 = 0; iVar10 < p->vCos->nSize; iVar10 = iVar10 + 1) {
    pGVar8 = Gia_ManCo(p,iVar10);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjFaninId0p(p,pGVar8);
    Sbd_ManDerive_rec(p_00,p,iVar3,vMirrors);
  }
  for (iVar10 = 0; iVar10 < p->vCos->nSize; iVar10 = iVar10 + 1) {
    pGVar8 = Gia_ManCo(p,iVar10);
    if (pGVar8 == (Gia_Obj_t *)0x0) break;
    iVar3 = Gia_ObjFanin0Copy(pGVar8);
    iVar4 = Abc_Lit2Var(iVar3);
    if (p_00->nObjs <= iVar4) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    iVar4 = Abc_Lit2Var(iVar3);
    pGVar9 = Gia_ManObj(p_00,iVar4);
    if ((~*(uint *)pGVar9 & 0x1fffffff) != 0 && (int)*(uint *)pGVar9 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar9 = Gia_ManAppendObj(p_00);
    *(ulong *)pGVar9 = *(ulong *)pGVar9 | 0x80000000;
    iVar4 = Gia_ObjId(p_00,pGVar9);
    iVar5 = Abc_Lit2Var(iVar3);
    *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xffffffffe0000000 | (ulong)(iVar4 - iVar5 & 0x1fffffff);
    iVar3 = Abc_LitIsCompl(iVar3);
    uVar1 = *(ulong *)pGVar9;
    *(ulong *)pGVar9 = uVar1 & 0xffffffffdfffffff | (ulong)(uint)(iVar3 << 0x1d);
    *(ulong *)pGVar9 =
         uVar1 & 0xe0000000dfffffff | (ulong)(uint)(iVar3 << 0x1d) |
         (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
    pVVar2 = p_00->vCos;
    iVar3 = Gia_ObjId(p_00,pGVar9);
    Vec_IntPush(pVVar2,iVar3);
    if (p_00->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(p_00,pGVar9 + -(ulong)((uint)*(undefined8 *)pGVar9 & 0x1fffffff),pGVar9);
    }
    iVar3 = Gia_ObjId(p_00,pGVar9);
    pGVar8->Value = iVar3 * 2;
  }
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  Gia_ManTransferTiming(p_00,p);
  if (pMan->pPars->fMapping != 0) {
    Sbd_ManDeriveMapping(pMan,p_00);
  }
  p_01 = Gia_ManCleanup(p_00);
  Gia_ManTransferTiming(p_01,p_00);
  Gia_ManTransferMapping(p_01,p_00);
  Gia_ManStop(p_00);
  return p_01;
}

Assistant:

Gia_Man_t * Sbd_ManDerive( Sbd_Man_t * pMan, Gia_Man_t * p, Vec_Int_t * vMirrors )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( p->pMuxes )
        pNew->pMuxes = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
        Sbd_ManDerive_rec( pNew, p, Gia_ObjFaninId0p(p, pObj), vMirrors );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManTransferTiming( pNew, p );
    if ( pMan->pPars->fMapping )
        Sbd_ManDeriveMapping( pMan, pNew );
    // remove dangling nodes
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManTransferTiming( pNew, pTemp );
    Gia_ManTransferMapping( pNew, pTemp );
    Gia_ManStop( pTemp );
    return pNew;
}